

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Int Omega_h::get_metrics_dim(LO nmetrics,Reals *metrics)

{
  Alloc *pAVar1;
  int ncomps;
  Int IVar2;
  size_t sVar3;
  
  pAVar1 = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  ncomps = divide_no_remainder<int>((int)(sVar3 >> 3),nmetrics);
  IVar2 = get_metric_dim(ncomps);
  return IVar2;
}

Assistant:

Int get_metrics_dim(LO nmetrics, Reals metrics) {
  auto ncomps = divide_no_remainder(metrics.size(), nmetrics);
  return get_metric_dim(ncomps);
}